

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcQuant.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkInitialState(Abc_Ntk_t *pNtk)

{
  Abc_Aig_t *pMan;
  int iVar1;
  int iVar2;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pAVar3;
  int local_24;
  int nVars;
  int i;
  Abc_Obj_t *pMiter;
  Abc_Ntk_t *pNtkNew;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkPiNum(pNtk);
  iVar2 = Abc_NtkIsStrash(pNtk);
  if (iVar2 != 0) {
    pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_STRASH,ABC_FUNC_AIG);
    _nVars = Abc_AigConst1(pNtk_00);
    for (local_24 = 0; local_24 < iVar1 / 2; local_24 = local_24 + 1) {
      pMan = (Abc_Aig_t *)pNtk_00->pManFunc;
      pAVar3 = Abc_NtkPi(pNtk_00,local_24);
      pAVar3 = Abc_ObjNot(pAVar3);
      _nVars = Abc_AigAnd(pMan,_nVars,pAVar3);
    }
    pAVar3 = Abc_NtkPo(pNtk_00,0);
    Abc_ObjAddFanin(pAVar3,_nVars);
    return pNtk_00;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcQuant.c"
                ,0x10a,"Abc_Ntk_t *Abc_NtkInitialState(Abc_Ntk_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkInitialState( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pMiter;
    int i, nVars = Abc_NtkPiNum(pNtk)/2;
    assert( Abc_NtkIsStrash(pNtk) );
    // start the new network 
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_STRASH, ABC_FUNC_AIG );
    // compute the all-zero state in terms of the CS variables
    pMiter = Abc_AigConst1(pNtkNew);
    for ( i = 0; i < nVars; i++ )
        pMiter = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, pMiter, Abc_ObjNot( Abc_NtkPi(pNtkNew, i) ) );
    // add the PO
    Abc_ObjAddFanin( Abc_NtkPo(pNtkNew,0), pMiter );
    return pNtkNew;
}